

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O0

void __thiscall APITests::test_wait_for_edge_rising(APITests *this)

{
  void *__stat_loc;
  long in_RDI;
  WaitResult result;
  future<void> dsc;
  size_t *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  allocator *paVar1;
  double in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  allocator local_91;
  string local_90 [24];
  string *in_stack_ffffffffffffff88;
  allocator in_stack_ffffffffffffff97;
  string local_68 [48];
  WaitResult local_38 [32];
  __basic_future<void> local_18;
  
  GPIO::setmode(BOARD);
  GPIO::setup(*(int *)(in_RDI + 0x20),OUT,0);
  GPIO::setup(*(int *)(in_RDI + 0x24),IN,-1);
  DelayedSetChannel(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  __stat_loc = (void *)(ulong)*(Edge *)(in_RDI + 0x24);
  GPIO::wait_for_edge((int)local_38,*(Edge *)(in_RDI + 0x24),2,10);
  std::__basic_future<void>::wait(&local_18,__stat_loc);
  GPIO::WaitResult::channel_abi_cxx11_(local_38);
  std::__cxx11::stoi(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,0);
  paVar1 = (allocator *)&stack0xffffffffffffff97;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"",paVar1);
  assert::is_true((bool)in_stack_ffffffffffffff97,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  GPIO::WaitResult::is_event_detected();
  paVar1 = &local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"",paVar1);
  assert::is_true((bool)in_stack_ffffffffffffff97,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  GPIO::cleanup();
  GPIO::WaitResult::~WaitResult((WaitResult *)0x1422ed);
  std::future<void>::~future((future<void> *)0x1422fa);
  return;
}

Assistant:

void test_wait_for_edge_rising()
    {
        GPIO::setmode(GPIO::BOARD);
        GPIO::setup(pin_data.out_a, GPIO::OUT, GPIO::LOW);
        GPIO::setup(pin_data.in_a, GPIO::IN);
        auto dsc = DelayedSetChannel(pin_data.out_a, GPIO::HIGH, 0.5);
        auto result = GPIO::wait_for_edge(pin_data.in_a, GPIO::RISING, 10, 1000);
        dsc.wait();
        assert::is_true(std::stoi(result.channel()) == pin_data.in_a);
        assert::is_true(result.is_event_detected());
        GPIO::cleanup();
    }